

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

int CECoordinates::ICRS2Observed
              (double ra,double dec,double *az,double *zen,double julian_date,double longitude,
              double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
              double relative_humidity,double dut1,double xp,double yp,double wavelength_um,
              double *observed_ra,double *observed_dec,double *hour_angle)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  double in_RSI;
  undefined8 *in_R8;
  double in_XMM2_Qa;
  double *in_XMM3_Qa;
  double *in_XMM4_Qa;
  CEDate *in_XMM5_Qa;
  CEAngleType *in_XMM6_Qa;
  CEAngleType *in_stack_00000028;
  int err_code;
  double *in_stack_00000050;
  CEDate date;
  double temp_hour_angle;
  double temp_dec;
  double temp_ra;
  undefined8 in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  double *return_dec;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff2c;
  double in_stack_ffffffffffffff30;
  double local_c0 [8];
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  
  local_70 = 0;
  local_78 = 0;
  local_80 = 0;
  local_58 = in_RDX;
  if (in_RDX == (undefined8 *)0x0) {
    local_58 = &local_70;
  }
  local_60 = in_RCX;
  if (in_RCX == (undefined8 *)0x0) {
    local_60 = &local_78;
  }
  local_68 = in_R8;
  if (in_R8 == (undefined8 *)0x0) {
    local_68 = &local_80;
  }
  return_dec = local_c0;
  CEDate::CEDate((CEDate *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08,(CEDateType)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  ICRS2CIRS(in_RSI,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,in_XMM6_Qa);
  iVar1 = CIRS2Observed((double)hour_angle,temp_ra,(double *)temp_dec,(double *)temp_hour_angle,
                        (double)date._56_8_,
                        (double)date.gregorian_date_vect_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,
                        (double)date.gregorian_date_vect_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish,
                        (double)date.gregorian_date_vect_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,date.gregorian_date_,
                        date.mod_julian_date_,(double)observed_ra,temperature_celsius,pressure_hPa,
                        elevation_m,latitude,(double *)date.julian_date_,(double *)date._vptr_CEDate
                        ,in_stack_00000050);
  CIRS2ICRS(in_stack_ffffffffffffff30,(double)CONCAT44(in_stack_ffffffffffffff2c,iVar1),
            (double *)CONCAT44(1,in_stack_ffffffffffffff20),return_dec,
            (CEDate *)CONCAT44(iVar1,in_stack_ffffffffffffff10),in_stack_00000028);
  CEDate::~CEDate((CEDate *)0x12adeb);
  return iVar1;
}

Assistant:

int CECoordinates::ICRS2Observed(double ra, double dec,
                                 double *az, double *zen,
                                 double julian_date,
                                 double longitude,
                                 double latitude,
                                 double elevation_m,
                                 double pressure_hPa,
                                 double temperature_celsius,
                                 double relative_humidity,
                                 double dut1,
                                 double xp, double yp,
                                 double wavelength_um,
                                 double *observed_ra,
                                 double *observed_dec,
                                 double *hour_angle)
{
    // Setup the observed RA, Dec and hour_angle variables
    double temp_ra(0.0);
    double temp_dec(0.0);
    double temp_hour_angle(0.0);

    // If values were passed, point these variables at the passed ones
    if (observed_ra  == nullptr) observed_ra  = &temp_ra;
    if (observed_dec == nullptr) observed_dec = &temp_dec;
    if (hour_angle   == nullptr) hour_angle   = &temp_hour_angle;
    
    // First convert the ICRS coordinates to CIRS coordinates
    CEDate date(julian_date, CEDateType::JD) ;
    ICRS2CIRS(ra, dec, &ra, &dec, date) ;
    
    // Call the necessary sofa method
    int err_code = CIRS2Observed(ra, dec,
                                 az, zen,
                                 julian_date,
                                 longitude,
                                 latitude,
                                 elevation_m,
                                 pressure_hPa,
                                 temperature_celsius,
                                 relative_humidity,
                                 dut1, xp, yp,
                                 wavelength_um,
                                 observed_ra,
                                 observed_dec,
                                 hour_angle) ;
    
    // Convert the apparent CIRS RA,Dec to ICRS RA,Dec
    CIRS2ICRS(*observed_ra, *observed_dec, observed_ra, observed_dec, 
              date, CEAngleType::RADIANS) ;
    
    return err_code ;
}